

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.h
# Opt level: O3

void __thiscall LPCMStreamReader::LPCMStreamReader(LPCMStreamReader *this)

{
  SimplePacketizerReader::SimplePacketizerReader(&this->super_SimplePacketizerReader);
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__SimplePacketizerReader_0023dbe0;
  this->m_useNewStyleAudioPES = false;
  memset(this->m_tmpFrameBuffer,0,0x4384);
  this->m_headerType = htNone;
  this->m_testMode = false;
  this->m_firstFrame = true;
  this->m_bitsPerSample = 0;
  this->m_freq = 0;
  this->m_channels = '\0';
  this->m_lfeExists = false;
  (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_demuxMode = false;
  this->m_curChunkLen = 0;
  this->m_frameRest = 0;
  this->m_needPCMHdr = true;
  this->m_openSizeWaveFormat = false;
  this->m_lastChannelRemapPos = (uint8_t *)0x0;
  return;
}

Assistant:

LPCMStreamReader() : m_useNewStyleAudioPES(false), m_tmpFrameBuffer()
    {
        m_bitsPerSample = m_freq = m_channels = 0;
        m_lfeExists = false;
        m_headerType = LPCMHeaderType::htNone;
        m_testMode = false;
        m_firstFrame = true;
        m_demuxMode = false;
        // m_waveHeaderParsed = false;
        m_curChunkLen = 0;
        m_channels = 0;
        m_frameRest = 0;
        m_needPCMHdr = true;
        m_openSizeWaveFormat = false;  // WAVE data size unknown and zero
        m_lastChannelRemapPos = nullptr;
    }